

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void * buffer_malloc(size_t amount)

{
  ulong uVar1;
  long lVar2;
  void *p;
  size_t amount_local;
  
  if (startup == 0) {
    die("unexpected buffer_malloc()");
  }
  uVar1 = amount + 3 & 0xfffffffffffffffc;
  if (0xffff < uVar1 + (long)malloc_total) {
    die("out of buffer space during initialisation");
  }
  lVar2 = (long)malloc_total;
  malloc_total = malloc_total + (int)uVar1;
  return malloc_headroom + lVar2;
}

Assistant:

static void * buffer_malloc(size_t amount) {
    // Only use buffer_malloc before we can use proper malloc...
    if (startup == 0)
        die("unexpected buffer_malloc()");

    amount = (amount + 3) & ~3; // round up to 4-byte aligned value.

    // space in buffer?
    if (amount + malloc_total >= sizeof malloc_headroom)
        die("out of buffer space during initialisation");

    // consume and return that much of the malloc_headroom
    void *p = malloc_headroom + malloc_total;
    malloc_total += amount;
    return p;
}